

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType(UniformType *this,GLenum _enumType,int _arraySize)

{
  this->enumType = _enumType;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->arraySize = _arraySize;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->strType)._M_dataplus._M_p = (pointer)&(this->strType).field_2;
  (this->strType)._M_string_length = 0;
  (this->strType).field_2._M_local_buf[0] = '\0';
  (this->refStrType)._M_dataplus._M_p = (pointer)&(this->refStrType).field_2;
  (this->refStrType)._M_string_length = 0;
  (this->refStrType).field_2._M_local_buf[0] = '\0';
  (this->size).first = 0;
  (this->size).second = 0;
  this->isArray = 0 < _arraySize;
  this->signedType = true;
  if (_arraySize == 0) {
    this->arraySize = 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->arraySizesSegmented,&this->arraySize);
  fill(this);
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}